

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

lu_mem singlestep(lua_State *L)

{
  global_State *g;
  GCObject *pGVar1;
  global_State *pgVar2;
  GCObject *pGVar3;
  lu_mem lVar4;
  lu_mem lVar5;
  long lVar6;
  int iVar7;
  lu_mem lVar8;
  lua_State *plVar9;
  GCObject *pGVar10;
  GCObject **ppGVar11;
  int iVar12;
  GCObject *pGVar13;
  GCObject *pGVar14;
  GCObject *f;
  GCObject *f_00;
  UpVal *pUVar15;
  lua_State **pplVar16;
  
  g = L->l_G;
  switch(g->gcstate) {
  case '\0':
    g->GCmemtrav = 0;
    propagatemark(g);
    if (g->gray == (GCObject *)0x0) {
      g->gcstate = '\x01';
    }
    goto LAB_00114ade;
  case '\x01':
    while (g->gray != (GCObject *)0x0) {
      propagatemark(g);
    }
    pgVar2 = L->l_G;
    pGVar1 = pgVar2->grayagain;
    pgVar2->gcstate = '\b';
    pgVar2->GCmemtrav = 0;
    if ((L->marked & 3) != 0) {
      reallymarkobject(pgVar2,(GCObject *)L);
    }
    if ((((pgVar2->l_registry).tt_ & 0x40) != 0) &&
       (pGVar3 = (pgVar2->l_registry).value_.gc, (pGVar3->marked & 3) != 0)) {
      reallymarkobject(pgVar2,pGVar3);
    }
    markmt(pgVar2);
    plVar9 = pgVar2->twups;
    if (plVar9 != (lua_State *)0x0) {
      pplVar16 = &pgVar2->twups;
      do {
        if (((plVar9->marked & 7) == 0) && (plVar9->openupval != (UpVal *)0x0)) {
          pplVar16 = &plVar9->twups;
        }
        else {
          *pplVar16 = plVar9->twups;
          plVar9->twups = plVar9;
          for (pUVar15 = plVar9->openupval; pUVar15 != (UpVal *)0x0;
              pUVar15 = (pUVar15->u).open.next) {
            if ((pUVar15->u).open.touched != 0) {
              if (((pUVar15->v->tt_ & 0x40) != 0) &&
                 (pGVar3 = (pUVar15->v->value_).gc, (pGVar3->marked & 3) != 0)) {
                reallymarkobject(pgVar2,pGVar3);
              }
              (pUVar15->u).open.touched = 0;
            }
          }
        }
        plVar9 = *pplVar16;
      } while (plVar9 != (lua_State *)0x0);
    }
    while (pgVar2->gray != (GCObject *)0x0) {
      propagatemark(pgVar2);
    }
    lVar8 = pgVar2->GCmemtrav;
    pgVar2->gray = pGVar1;
    while (pGVar1 != (GCObject *)0x0) {
      propagatemark(pgVar2);
      pGVar1 = pgVar2->gray;
    }
    pgVar2->GCmemtrav = 0;
    convergeephemerons(pgVar2);
    clearvalues(pgVar2,pgVar2->weak,(GCObject *)0x0);
    clearvalues(pgVar2,pgVar2->allweak,(GCObject *)0x0);
    lVar4 = pgVar2->GCmemtrav;
    pGVar1 = pgVar2->weak;
    pGVar3 = pgVar2->allweak;
    pGVar14 = (GCObject *)&pgVar2->tobefnz;
    do {
      pGVar10 = pGVar14;
      pGVar14 = pGVar10->next;
    } while (pGVar10->next != (GCObject *)0x0);
    if (pgVar2->finobj != (GCObject *)0x0) {
      pGVar13 = (GCObject *)&pgVar2->finobj;
      pGVar14 = pgVar2->finobj;
      do {
        if ((pGVar14->marked & 3) != 0) {
          pGVar13->next = pGVar14->next;
          pGVar14->next = pGVar10->next;
          pGVar10->next = pGVar14;
          pGVar10 = pGVar14;
          pGVar14 = pGVar13;
        }
        ppGVar11 = &pGVar14->next;
        pGVar13 = pGVar14;
        pGVar14 = *ppGVar11;
      } while (*ppGVar11 != (GCObject *)0x0);
    }
    pgVar2->gcfinnum = 1;
    markbeingfnz(pgVar2);
    while (pgVar2->gray != (GCObject *)0x0) {
      propagatemark(pgVar2);
    }
    pgVar2->GCmemtrav = 0;
    convergeephemerons(pgVar2);
    clearkeys(pgVar2,pgVar2->ephemeron,f);
    clearkeys(pgVar2,pgVar2->allweak,f_00);
    clearvalues(pgVar2,pgVar2->weak,pGVar1);
    clearvalues(pgVar2,pgVar2->allweak,pGVar3);
    luaS_clearcache(pgVar2);
    pgVar2->currentwhite = pgVar2->currentwhite ^ 3;
    lVar5 = pgVar2->GCmemtrav;
    pgVar2 = L->l_G;
    pgVar2->gcstate = '\x02';
    ppGVar11 = sweeplist(L,&pgVar2->allgc,1);
    pgVar2->sweepgc = ppGVar11;
    g->GCestimate = g->GCdebt + g->totalbytes;
    return lVar4 + lVar8 + lVar5;
  case '\x02':
    ppGVar11 = &g->finobj;
    iVar7 = 3;
    break;
  case '\x03':
    ppGVar11 = &g->tobefnz;
    iVar7 = 4;
    break;
  case '\x04':
    iVar7 = 5;
    ppGVar11 = (GCObject **)0x0;
    break;
  case '\x05':
    g->mainthread->marked = g->currentwhite & 3 | g->mainthread->marked & 0xf8;
    if (g->gckind != '\x01') {
      iVar7 = (g->strt).size;
      iVar12 = iVar7 + 3;
      if (-1 < iVar7) {
        iVar12 = iVar7;
      }
      lVar6 = g->GCdebt;
      if ((g->strt).nuse < iVar12 >> 2) {
        luaS_resize(L,iVar7 / 2);
      }
      g->GCestimate = g->GCestimate + (g->GCdebt - lVar6);
    }
    g->gcstate = '\x06';
    return 0;
  case '\x06':
    if ((g->tobefnz != (GCObject *)0x0) && (g->gckind != '\x01')) {
      iVar7 = runafewfinalizers(L);
      return (long)iVar7 * 7;
    }
    g->gcstate = '\a';
    return 0;
  case '\a':
    g->GCmemtrav = (long)(g->strt).size << 3;
    g->gray = (GCObject *)0x0;
    g->grayagain = (GCObject *)0x0;
    g->weak = (GCObject *)0x0;
    g->ephemeron = (GCObject *)0x0;
    g->allweak = (GCObject *)0x0;
    if ((g->mainthread->marked & 3) != 0) {
      reallymarkobject(g,(GCObject *)g->mainthread);
    }
    if ((((g->l_registry).tt_ & 0x40) != 0) &&
       (pGVar1 = (g->l_registry).value_.gc, (pGVar1->marked & 3) != 0)) {
      reallymarkobject(g,pGVar1);
    }
    markmt(g);
    markbeingfnz(g);
    g->gcstate = '\0';
LAB_00114ade:
    return g->GCmemtrav;
  default:
    return 0;
  }
  lVar8 = sweepstep(L,g,iVar7,ppGVar11);
  return lVar8;
}

Assistant:

static lu_mem singlestep (lua_State *L) {
  global_State *g = G(L);
  switch (g->gcstate) {
    case GCSpause: {
      g->GCmemtrav = g->strt.size * sizeof(GCObject*);
      restartcollection(g);
      g->gcstate = GCSpropagate;
      return g->GCmemtrav;
    }
    case GCSpropagate: {
      g->GCmemtrav = 0;
      lua_assert(g->gray);
      propagatemark(g);
       if (g->gray == NULL)  /* no more gray objects? */
        g->gcstate = GCSatomic;  /* finish propagate phase */
      return g->GCmemtrav;  /* memory traversed in this step */
    }
    case GCSatomic: {
      lu_mem work;
      propagateall(g);  /* make sure gray list is empty */
      work = atomic(L);  /* work is what was traversed by 'atomic' */
      entersweep(L);
      g->GCestimate = gettotalbytes(g);  /* first estimate */;
      return work;
    }
    case GCSswpallgc: {  /* sweep "regular" objects */
      return sweepstep(L, g, GCSswpfinobj, &g->finobj);
    }
    case GCSswpfinobj: {  /* sweep objects with finalizers */
      return sweepstep(L, g, GCSswptobefnz, &g->tobefnz);
    }
    case GCSswptobefnz: {  /* sweep objects to be finalized */
      return sweepstep(L, g, GCSswpend, NULL);
    }
    case GCSswpend: {  /* finish sweeps */
      makewhite(g, g->mainthread);  /* sweep main thread */
      checkSizes(L, g);
      g->gcstate = GCScallfin;
      return 0;
    }
    case GCScallfin: {  /* call remaining finalizers */
      if (g->tobefnz && g->gckind != KGC_EMERGENCY) {
        int n = runafewfinalizers(L);
        return (n * GCFINALIZECOST);
      }
      else {  /* emergency mode or no more finalizers */
        g->gcstate = GCSpause;  /* finish collection */
        return 0;
      }
    }
    default: lua_assert(0); return 0;
  }
}